

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O2

int anon_unknown.dwarf_22b2f::ChannelOut_omni(lua_State *L)

{
  int iVar1;
  int iVar2;
  ChannelOut *this;
  
  this = getChannelOut(L,1);
  iVar1 = this->index;
  iVar2 = lua_toboolean(L,2);
  ChannelOut::send<int,int,int>(this,iVar1 + 0xb0,0x7d - (uint)(iVar2 == 0),0);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_omni(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	self.send(0xB0 + self.index, lua_toboolean(L, 2) ? 0x7D : 0x7C, 0x00);
	lua_settop(L, 1);
	return 1;
}